

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_reporting.cc
# Opt level: O0

string * __thiscall
gflags::DescribeOneFlagInXML_abi_cxx11_
          (string *__return_storage_ptr__,gflags *this,CommandLineFlagInfo *flag)

{
  allocator<char> local_1a;
  undefined1 local_19;
  string *local_18;
  CommandLineFlagInfo *flag_local;
  string *r;
  
  local_19 = 0;
  local_18 = (string *)this;
  flag_local = (CommandLineFlagInfo *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"<flag>",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  AddXMLTag(__return_storage_ptr__,"file",local_18 + 5);
  AddXMLTag(__return_storage_ptr__,"name",local_18);
  AddXMLTag(__return_storage_ptr__,"meaning",local_18 + 2);
  AddXMLTag(__return_storage_ptr__,"default",local_18 + 4);
  AddXMLTag(__return_storage_ptr__,"current",local_18 + 3);
  AddXMLTag(__return_storage_ptr__,"type",local_18 + 1);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"</flag>");
  return __return_storage_ptr__;
}

Assistant:

static string DescribeOneFlagInXML(const CommandLineFlagInfo& flag) {
  // The file and flagname could have been attributes, but default
  // and meaning need to avoid attribute normalization.  This way it
  // can be parsed by simple programs, in addition to xml parsers.
  string r("<flag>");
  AddXMLTag(&r, "file", flag.filename);
  AddXMLTag(&r, "name", flag.name);
  AddXMLTag(&r, "meaning", flag.description);
  AddXMLTag(&r, "default", flag.default_value);
  AddXMLTag(&r, "current", flag.current_value);
  AddXMLTag(&r, "type", flag.type);
  r += "</flag>";
  return r;
}